

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall Refal2::CFunctionBuilder::AddEndOfRight(CFunctionBuilder *this)

{
  value_type this_00;
  bool bVar1;
  reference ppCVar2;
  TErrorCode errorCode;
  CUnitNode *unit;
  CFunctionBuilder *this_local;
  
  while( true ) {
    bVar1 = std::
            stack<Refal2::CNode<Refal2::CUnit>_*,_std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>_>
            ::empty(&this->balanceStack);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = std::
              stack<Refal2::CNode<Refal2::CUnit>_*,_std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>_>
              ::top(&this->balanceStack);
    this_00 = *ppCVar2;
    std::
    stack<Refal2::CNode<Refal2::CUnit>_*,_std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>_>
    ::pop(&this->balanceStack);
    bVar1 = CUnit::IsLeftParen(&this_00->super_CUnit);
    errorCode = EC_UnclosedLeftBracketInRightPart;
    if (bVar1) {
      errorCode = EC_UnclosedLeftParenInRightPart;
    }
    error(this,errorCode);
  }
  if (((this->super_CVariablesBuilder).field_0x1aac & 1) == 0) {
    error(this,EC_ThereAreNoPartsSeparatorInRules);
  }
  bVar1 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
  if (bVar1) {
    CNodeList<Refal2::CUnit>::Empty(&(this->acc).super_CNodeList<Refal2::CUnit>);
    CVariablesBuilder::Reset(&this->super_CVariablesBuilder);
  }
  else {
    addRule(this);
  }
  (this->super_CVariablesBuilder).field_0x1aad = 0;
  (this->super_CVariablesBuilder).field_0x1aac = 0;
  return;
}

Assistant:

void CFunctionBuilder::AddEndOfRight()
{
	while( !balanceStack.empty() ) {
		CUnitNode* unit = balanceStack.top();
		balanceStack.pop();
		error( unit->IsLeftParen() ? EC_UnclosedLeftParenInRightPart :
			EC_UnclosedLeftBracketInRightPart );
	}
	if( !isProcessRightPart ) {
		error( EC_ThereAreNoPartsSeparatorInRules );
	}
	if( HasErrors() ) {
		acc.Empty();
		CVariablesBuilder::Reset();
	} else {
		addRule();
	}
	isRightDirection = false; // reset right direction flag
	isProcessRightPart = false;
}